

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ion_master_table.c
# Opt level: O0

ion_err_t ion_master_table_get_next_id(ion_dictionary_id_t *id)

{
  ion_dictionary_id_t iVar1;
  undefined1 local_3c [8];
  ion_dictionary_config_info_t master_config;
  ion_err_t error;
  ion_dictionary_id_t *id_local;
  
  master_config.dictionary_type._3_1_ = dictionary_type_bpp_tree_t >> 0x18;
  unique0x1000005e = id;
  memset(local_3c,0,0x20);
  local_3c._0_4_ = ion_master_table_next_id + 1;
  id_local._7_1_ = ion_master_table_write((ion_dictionary_config_info_t *)local_3c,0);
  if (id_local._7_1_ == '\0') {
    iVar1 = ion_master_table_next_id + 1;
    *stack0xffffffffffffffe8 = ion_master_table_next_id;
    ion_master_table_next_id = iVar1;
    id_local._7_1_ = '\0';
  }
  return id_local._7_1_;
}

Assistant:

ion_err_t
ion_master_table_get_next_id(
	ion_dictionary_id_t *id
) {
	ion_err_t error								= err_ok;

	/* Flush master row. This writes the next ID to be used, so add 1. */
	ion_dictionary_config_info_t master_config	= { .id = ion_master_table_next_id + 1 };

	error = ion_master_table_write(&master_config, 0);

	if (err_ok != error) {
		return error;
	}

	*id = ion_master_table_next_id++;

	return err_ok;
}